

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

bool Hex::Hexdumper<unsigned_char>::
     data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
               (pair<const_unsigned_char_*,_const_unsigned_char_*> *a,
               pair<const_unsigned_char_*,_const_unsigned_char_*> *b)

{
  uchar *__s1;
  uchar *puVar1;
  uchar *__s2;
  int iVar2;
  bool bVar3;
  
  __s1 = a->first;
  puVar1 = a->second;
  __s2 = b->first;
  bVar3 = true;
  if (puVar1 != b->second || __s1 != __s2) {
    if ((long)puVar1 - (long)__s1 != (long)b->second - (long)__s2) {
      return false;
    }
    if (puVar1 != __s1) {
      iVar2 = bcmp(__s1,__s2,(long)puVar1 - (long)__s1);
      bVar3 = iVar2 == 0;
    }
  }
  return bVar3;
}

Assistant:

static bool data_is_equal(const PAIR& a, const PAIR& b)
    {
        if (a==b)
            return true;
        if (a.second-a.first != b.second-b.first)
            return false;
        return std::equal(a.first, a.second, b.first);
    }